

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O1

void __thiscall
btSimpleDynamicsWorld::predictUnconstraintMotion(btSimpleDynamicsWorld *this,btScalar timeStep)

{
  int iVar1;
  btRigidBody *this_00;
  long lVar2;
  
  if (0 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size) {
    lVar2 = 0;
    do {
      this_00 = (btRigidBody *)
                (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data
                [lVar2];
      if ((((this_00 != (btRigidBody *)0x0) &&
           (((this_00->super_btCollisionObject).m_internalType & 2U) != 0)) &&
          (((this_00->super_btCollisionObject).m_collisionFlags & 1) == 0)) &&
         ((iVar1 = (this_00->super_btCollisionObject).m_activationState1, iVar1 != 2 && (iVar1 != 5)
          ))) {
        btRigidBody::applyGravity(this_00);
        btRigidBody::integrateVelocities(this_00,timeStep);
        btRigidBody::applyDamping(this_00,timeStep);
        btRigidBody::predictIntegratedTransform
                  (this_00,timeStep,
                   &(this_00->super_btCollisionObject).m_interpolationWorldTransform);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size)
    ;
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::predictUnconstraintMotion(btScalar timeStep)
{
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			if (!body->isStaticObject())
			{
				if (body->isActive())
				{
					body->applyGravity();
					body->integrateVelocities( timeStep);
					body->applyDamping(timeStep);
					body->predictIntegratedTransform(timeStep,body->getInterpolationWorldTransform());
				}
			}
		}
	}
}